

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int RAWToRGB24(uint8_t *src_raw,int src_stride_raw,uint8_t *dst_rgb24,int dst_stride_rgb24,int width
              ,int height)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_3c;
  code *local_38;
  
  if ((height == 0 || width < 1) || (dst_rgb24 == (uint8_t *)0x0 || src_raw == (uint8_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_raw = src_raw + ~height * src_stride_raw;
      src_stride_raw = -src_stride_raw;
    }
    local_3c = dst_stride_rgb24;
    if (width * 3 == dst_stride_rgb24 && src_stride_raw == width * 3) {
      width = iVar1 * width;
      iVar1 = 1;
      src_stride_raw = 0;
      local_3c = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x40);
    if ((width & 7U) == 0) {
      local_38 = RAWToRGB24Row_SSSE3;
    }
    else {
      local_38 = RAWToRGB24Row_Any_SSSE3;
    }
    if (iVar2 == 0) {
      local_38 = RAWToRGB24Row_C;
    }
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      (*local_38)(src_raw,dst_rgb24,width);
      src_raw = src_raw + src_stride_raw;
      dst_rgb24 = dst_rgb24 + local_3c;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int RAWToRGB24(const uint8_t* src_raw,
               int src_stride_raw,
               uint8_t* dst_rgb24,
               int dst_stride_rgb24,
               int width,
               int height) {
  int y;
  void (*RAWToRGB24Row)(const uint8_t* src_rgb, uint8_t* dst_rgb24, int width) =
      RAWToRGB24Row_C;
  if (!src_raw || !dst_rgb24 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_raw = src_raw + (height - 1) * src_stride_raw;
    src_stride_raw = -src_stride_raw;
  }
  // Coalesce rows.
  if (src_stride_raw == width * 3 && dst_stride_rgb24 == width * 3) {
    width *= height;
    height = 1;
    src_stride_raw = dst_stride_rgb24 = 0;
  }
#if defined(HAS_RAWTORGB24ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    RAWToRGB24Row = RAWToRGB24Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      RAWToRGB24Row = RAWToRGB24Row_SSSE3;
    }
  }
#endif
#if defined(HAS_RAWTORGB24ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    RAWToRGB24Row = RAWToRGB24Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      RAWToRGB24Row = RAWToRGB24Row_NEON;
    }
  }
#endif
#if defined(HAS_RAWTORGB24ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    RAWToRGB24Row = RAWToRGB24Row_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      RAWToRGB24Row = RAWToRGB24Row_MMI;
    }
  }
#endif
#if defined(HAS_RAWTORGB24ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    RAWToRGB24Row = RAWToRGB24Row_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      RAWToRGB24Row = RAWToRGB24Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    RAWToRGB24Row(src_raw, dst_rgb24, width);
    src_raw += src_stride_raw;
    dst_rgb24 += dst_stride_rgb24;
  }
  return 0;
}